

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_strfmt.c
# Opt level: O3

char * lj_strfmt_wstrnum(lua_State *L,cTValue *o,MSize *lenp)

{
  char *pcVar1;
  SBuf *pSVar2;
  ulong uVar3;
  
  if ((o->field_2).it == 0xfffffffb) {
    *lenp = *(MSize *)((ulong)(o->u32).lo + 0xc);
    pcVar1 = (char *)((ulong)(o->u32).lo + 0x10);
  }
  else if ((o->field_2).it < 0xfffeffff) {
    uVar3 = (ulong)(L->glref).ptr32;
    *(int *)(uVar3 + 0xf4) = (int)L;
    *(undefined4 *)(uVar3 + 0xe8) = *(undefined4 *)(uVar3 + 0xf0);
    pSVar2 = lj_strfmt_putfnum((SBuf *)(uVar3 + 0xe8),0xf000035,o->n);
    *lenp = (pSVar2->p).ptr32 - (pSVar2->b).ptr32;
    pcVar1 = (char *)(ulong)(pSVar2->b).ptr32;
  }
  else {
    pcVar1 = (char *)0x0;
  }
  return pcVar1;
}

Assistant:

const char *lj_strfmt_wstrnum(lua_State *L, cTValue *o, MSize *lenp)
{
  SBuf *sb;
  if (tvisstr(o)) {
    *lenp = strV(o)->len;
    return strVdata(o);
  } else if (tvisint(o)) {
    sb = lj_strfmt_putint(lj_buf_tmp_(L), intV(o));
  } else if (tvisnum(o)) {
    sb = lj_strfmt_putfnum(lj_buf_tmp_(L), STRFMT_G14, o->n);
  } else {
    return NULL;
  }
  *lenp = sbuflen(sb);
  return sbufB(sb);
}